

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O2

bool cmSystemTools::IsInternallyOn(char *val)

{
  bool bVar1;
  int iVar2;
  _Alloc_hider _Var3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> v;
  allocator local_29;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_28;
  
  if (val == (char *)0x0) {
    bVar1 = false;
  }
  else {
    std::__cxx11::string::string((string *)&local_28,val,&local_29);
    _Var3._M_p = local_28._M_dataplus._M_p;
    if (local_28._M_string_length < 5) {
      for (; _Var3._M_p != local_28._M_dataplus._M_p + local_28._M_string_length;
          _Var3._M_p = _Var3._M_p + 1) {
        iVar2 = toupper((int)*_Var3._M_p);
        *_Var3._M_p = (char)iVar2;
      }
      bVar1 = std::operator==(&local_28,"I_ON");
    }
    else {
      bVar1 = false;
    }
    std::__cxx11::string::~string((string *)&local_28);
  }
  return bVar1;
}

Assistant:

bool cmSystemTools::IsInternallyOn(const char* val)
{
  if (!val)
    {
    return false;
    }
  std::basic_string<char> v = val;
  if (v.size() > 4)
    {
    return false;
    }

  for(std::basic_string<char>::iterator c = v.begin();
      c != v.end(); c++)
    {
    *c = static_cast<char>(toupper(*c));
    }
  return v == "I_ON";
}